

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::InitAmr(Amr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pIVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ostream *poVar13;
  int i_1;
  int i_2;
  ulong uVar14;
  uint uVar15;
  size_type sVar16;
  LevelBld *pLVar17;
  int i;
  long lVar18;
  int i_3;
  ulong uVar19;
  string *psVar20;
  ulong uVar21;
  int ngrid;
  int iStack_4a0;
  int local_49c;
  int local_498 [2];
  undefined8 uStack_490;
  BoxList bl_1;
  int in_finest_1;
  string *local_458;
  Vector<int,_std::allocator<int>_> *local_450;
  int ngrid_1;
  ParmParse pp;
  int in_finest;
  string log_file_name;
  int aiStack_3a0 [122];
  BoxList bl;
  
  pLVar17 = this->levelbld;
  if (pLVar17 == (LevelBld *)0x0) {
    Assert_host("levelbld != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Amr/AMReX_Amr.cpp"
                ,0xe5,"\"ERROR: levelbld is nullptr\"");
    pLVar17 = this->levelbld;
  }
  (**(code **)(*(long *)pLVar17 + 0x10))();
  this->plot_int = -1;
  this->small_plot_int = -1;
  this->last_plotfile = 0;
  this->last_smallplotfile = -1;
  this->last_checkpoint = 0;
  this->record_grid_info = 0;
  this->record_run_info = 0;
  this->file_name_digits = 5;
  this->message_int = 10;
  this->record_run_info_terse = 0;
  this->bUserStopRequest = false;
  for (lVar12 = 0x1e8; lVar12 != 0x1eb; lVar12 = lVar12 + 1) {
    *(undefined1 *)((long)&(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh + lVar12) = 0;
  }
  std::__cxx11::string::string((string *)&log_file_name,"amr",(allocator *)&bl);
  ParmParse::ParmParse(&pp,&log_file_name);
  std::__cxx11::string::~string((string *)&log_file_name);
  ParmParse::queryAdd<int,_0>(&pp,"regrid_on_restart",&(anonymous_namespace)::regrid_on_restart);
  ParmParse::queryAdd<int,_0>
            (&pp,"use_efficient_regrid",&(anonymous_namespace)::use_efficient_regrid);
  ParmParse::queryAdd<int,_0>(&pp,"plotfile_on_restart",&(anonymous_namespace)::plotfile_on_restart)
  ;
  ParmParse::queryAdd<int,_0>(&pp,"insitu_on_restart",&(anonymous_namespace)::insitu_on_restart);
  ParmParse::queryAdd<int,_0>
            (&pp,"checkpoint_on_restart",&(anonymous_namespace)::checkpoint_on_restart);
  ParmParse::queryAdd<int,_0>(&pp,"compute_new_dt_on_regrid",&compute_new_dt_on_regrid);
  ParmParse::queryAdd<int,_0>(&pp,"mffile_nstreams",&(anonymous_namespace)::mffile_nstreams);
  ParmParse::queryAdd<int,_0>(&pp,"probinit_natonce",&(anonymous_namespace)::probinit_natonce);
  iVar10 = *(int *)(ParallelContext::frames + 0x10);
  if ((anonymous_namespace)::probinit_natonce < *(int *)(ParallelContext::frames + 0x10)) {
    iVar10 = (anonymous_namespace)::probinit_natonce;
  }
  (anonymous_namespace)::probinit_natonce = 1;
  if (1 < iVar10) {
    (anonymous_namespace)::probinit_natonce = iVar10;
  }
  ParmParse::queryAdd<int,_0>(&pp,"file_name_digits",&this->file_name_digits);
  local_458 = &this->initial_grids_file;
  ParmParse::queryAdd(&pp,"initial_grid_file",local_458);
  psVar20 = &this->regrid_grids_file;
  ParmParse::queryAdd(&pp,"regrid_file",psVar20);
  ParmParse::queryAdd<int,_0>(&pp,"message_int",&this->message_int);
  bVar8 = ParmParse::contains(&pp,"run_log");
  paVar1 = &log_file_name.field_2;
  if (bVar8) {
    log_file_name._M_string_length = 0;
    log_file_name.field_2._M_local_buf[0] = '\0';
    log_file_name._M_dataplus._M_p = (pointer)paVar1;
    ParmParse::get(&pp,"run_log",&log_file_name,0);
    setRecordRunInfo(this,&log_file_name);
    std::__cxx11::string::~string((string *)&log_file_name);
  }
  bVar8 = ParmParse::contains(&pp,"run_log_terse");
  if (bVar8) {
    log_file_name._M_string_length = 0;
    log_file_name.field_2._M_local_buf[0] = '\0';
    log_file_name._M_dataplus._M_p = (pointer)paVar1;
    ParmParse::get(&pp,"run_log_terse",&log_file_name,0);
    setRecordRunInfoTerse(this,&log_file_name);
    std::__cxx11::string::~string((string *)&log_file_name);
  }
  bVar8 = ParmParse::contains(&pp,"grid_log");
  if (bVar8) {
    log_file_name._M_string_length = 0;
    log_file_name.field_2._M_local_buf[0] = '\0';
    log_file_name._M_dataplus._M_p = (pointer)paVar1;
    ParmParse::get(&pp,"grid_log",&log_file_name,0);
    setRecordGridInfo(this,&log_file_name);
    std::__cxx11::string::~string((string *)&log_file_name);
  }
  bVar8 = ParmParse::contains(&pp,"data_log");
  if (bVar8) {
    uVar9 = ParmParse::countval(&pp,"data_log",-1);
    std::
    vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
    ::resize(&(this->datalog).
              super_vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
             ,(long)(int)uVar9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&(this->datalogname).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,(long)(int)uVar9);
    uVar21 = 0;
    ParmParse::queryarr(&pp,"data_log",
                        &(this->datalogname).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ,0,uVar9);
    uVar14 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar14 = uVar21;
    }
    for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
      setRecordDataInfo(this,(int)uVar19,
                        (string *)
                        ((long)&(((this->datalogname).
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        uVar21));
      uVar21 = uVar21 + 0x20;
    }
  }
  std::__cxx11::string::assign((char *)&this->probin_file);
  bVar8 = ParmParse::contains(&pp,"probin_file");
  if (bVar8) {
    ParmParse::get(&pp,"probin_file",&this->probin_file,0);
  }
  ParmParse::queryAdd(&pp,"restart",&this->restart_chkfile);
  ParmParse::queryAdd(&pp,"restart_from_plotfile",&this->restart_pltfile);
  lVar12 = (long)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  sVar16 = lVar12 + 1;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->dt_level).super_vector<double,_std::allocator<double>_>,sVar16);
  local_450 = &this->level_steps;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_450->super_vector<int,_std::allocator<int>_>,sVar16);
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->level_count).super_vector<int,_std::allocator<int>_>,sVar16);
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->n_cycle).super_vector<int,_std::allocator<int>_>,sVar16);
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->dt_min).super_vector<double,_std::allocator<double>_>,sVar16);
  std::
  vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::resize(&(this->amr_level).
            super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ,sVar16);
  pdVar2 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (local_450->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar4 = (this->level_count).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar5 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  pdVar6 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (lVar18 = 0; lVar18 <= lVar12; lVar18 = lVar18 + 1) {
    pdVar2[lVar18] = 1e+200;
    piVar3[lVar18] = 0;
    piVar4[lVar18] = 0;
    piVar5[lVar18] = 0;
    pdVar6[lVar18] = 0.0;
  }
  sVar16 = (size_type)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  if (0 < (long)sVar16) {
    std::vector<int,_std::allocator<int>_>::resize
              (&(this->regrid_int).super_vector<int,_std::allocator<int>_>,sVar16);
    piVar3 = (this->regrid_int).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    for (lVar12 = 0; lVar12 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
        lVar12 = lVar12 + 1) {
      piVar3[lVar12] = 1;
    }
  }
  initPltAndChk(this);
  initSubcycle(this);
  if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level < 1) goto LAB_00472c8e;
  iVar10 = ParmParse::countval(&pp,"regrid_int",-1);
  if (iVar10 == 0) {
    if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose != 0) {
      poVar13 = ErrorStream();
      Print::Print((Print *)&log_file_name,poVar13);
      std::operator<<((ostream *)log_file_name.field_2._M_local_buf,
                      "Using default regrid_int = 1 at all levels!\n");
      Print::~Print((Print *)&log_file_name);
    }
LAB_0047269a:
    iVar10 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  }
  else {
    if (iVar10 != 1) {
      iVar11 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      if (iVar10 < iVar11) {
        Error_host("You did not specify enough values of regrid_int");
      }
      else {
        ParmParse::queryarr(&pp,"regrid_int",
                            &(this->regrid_int).super_vector<int,_std::allocator<int>_>,0,iVar11);
      }
      goto LAB_0047269a;
    }
    log_file_name._M_dataplus._M_p = log_file_name._M_dataplus._M_p & 0xffffffff00000000;
    ParmParse::query(&pp,"regrid_int",(int *)&log_file_name,0);
    piVar3 = (this->regrid_int).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    for (lVar12 = 0; iVar10 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level,
        lVar12 < iVar10; lVar12 = lVar12 + 1) {
      piVar3[lVar12] = (int)log_file_name._M_dataplus._M_p;
    }
  }
  if ((0 < iVar10) && ((this->initial_grids_file)._M_string_length != 0)) {
    std::ifstream::ifstream(&log_file_name,(local_458->_M_dataplus)._M_p,_S_in);
    if (*(int *)((long)aiStack_3a0 + *(long *)(log_file_name._M_dataplus._M_p + -0x18)) != 0) {
      FileOpenFailed(local_458);
    }
    std::istream::operator>>((istream *)&log_file_name,&in_finest);
    lVar12 = 1;
    do {
      iVar10 = std::istream::get();
    } while (iVar10 != 10);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&initial_ba,
               (long)in_finest);
    (this->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_upto_level = in_finest;
    if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level < in_finest) {
      Error_host("You have fewer levels in your inputs file then in your grids file!");
    }
    for (; lVar12 <= in_finest; lVar12 = lVar12 + 1) {
      BoxList::BoxList(&bl);
      std::istream::operator>>((istream *)&log_file_name,&ngrid);
      do {
        iVar10 = std::istream::get();
      } while (iVar10 != 10);
      for (iVar10 = 0; iVar10 < ngrid; iVar10 = iVar10 + 1) {
        bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x100000001;
        bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = 1;
        bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _12_8_ = 0;
        bl_1._20_8_ = 0;
        amrex::operator>>((istream *)&log_file_name,(Box *)&bl_1);
        do {
          iVar11 = std::istream::get();
        } while (iVar11 != 10);
        pIVar7 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (((pIVar7[lVar12 + -1].vect[0] != 1) || (pIVar7[lVar12 + -1].vect[1] != 1)) ||
           (pIVar7[lVar12 + -1].vect[2] != 1)) {
          bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start._4_4_ *
                                 pIVar7[lVar12 + -1].vect[1],
                                 pIVar7[lVar12 + -1].vect[0] *
                                 (int)bl_1.m_lbox.
                                      super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
          bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               (int)bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish * pIVar7[lVar12 + -1].vect[2];
          uVar9 = (uint)((bl_1._20_8_ & 0x200000000) == 0);
          uVar15 = (uint)((bl_1._20_8_ & 0x400000000) == 0);
          bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               ((int)bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + uVar9) *
               pIVar7[lVar12 + -1].vect[1] - uVar9;
          bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ =
               (bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_ + (~bl_1.btype.itype & 1)) *
               pIVar7[lVar12 + -1].vect[0] - (~bl_1.btype.itype & 1);
          bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               (bl_1.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ + uVar15) *
               pIVar7[lVar12 + -1].vect[2] - uVar15;
        }
        std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                  ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&bl,(value_type *)&bl_1);
      }
      BoxArray::define((BoxArray *)(initial_ba + lVar12 * 0x68 + -0x68),&bl);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl);
    }
    std::ifstream::close();
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
      poVar13 = OutStream();
      Print::Print((Print *)&bl,poVar13);
      poVar13 = (ostream *)
                &bl.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::operator<<(poVar13,"Read initial_ba. Size is ");
      std::ostream::_M_insert<long>((long)poVar13);
      std::operator<<(poVar13,"\n");
      Print::~Print((Print *)&bl);
    }
    std::ifstream::~ifstream(&log_file_name);
    iVar10 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  }
  if ((0 < iVar10) && ((this->regrid_grids_file)._M_string_length != 0)) {
    std::ifstream::ifstream(&log_file_name,(psVar20->_M_dataplus)._M_p,_S_in);
    if (*(int *)((long)aiStack_3a0 + *(long *)(log_file_name._M_dataplus._M_p + -0x18)) != 0) {
      FileOpenFailed(psVar20);
    }
    std::istream::operator>>((istream *)&log_file_name,&in_finest_1);
    do {
      iVar10 = std::istream::get();
    } while (iVar10 != 10);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&regrid_ba,
               (long)in_finest_1);
    lVar12 = 0xc;
    for (psVar20 = (string *)0x1; (long)psVar20 <= (long)in_finest_1;
        psVar20 = (string *)((long)&(psVar20->_M_dataplus)._M_p + 1)) {
      BoxList::BoxList(&bl_1);
      std::istream::operator>>((istream *)&log_file_name,&ngrid_1);
      do {
        iVar10 = std::istream::get();
      } while (iVar10 != 10);
      local_450 = (Vector<int,_std::allocator<int>_> *)((long)psVar20 * 0xc);
      local_458 = psVar20;
      for (iVar10 = 0; psVar20 = local_458, iVar10 < ngrid_1; iVar10 = iVar10 + 1) {
        ngrid = 1;
        iStack_4a0 = 1;
        local_49c = 1;
        local_498[0] = 0;
        local_498[1] = 0;
        uStack_490 = 0;
        amrex::operator>>((istream *)&log_file_name,(Box *)&ngrid);
        do {
          iVar11 = std::istream::get();
        } while (iVar11 != 10);
        pIVar7 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar11 = *(int *)((long)&(local_450->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_> +
                         (long)pIVar7[-1].vect);
        if (((iVar11 != 1) || (*(int *)((long)(pIVar7[-1].vect + 1) + (long)local_450) != 1)) ||
           (*(int *)((long)&(local_450->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_> +
                    (long)(pIVar7[-1].vect + 2)) != 1)) {
          iStack_4a0 = iStack_4a0 *
                       *(int *)((long)&(local_450->super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_> +
                               (long)(pIVar7[-1].vect + 1));
          ngrid = iVar11 * ngrid;
          local_49c = local_49c *
                      *(int *)((long)&(local_450->super_vector<int,_std::allocator<int>_>).
                                      super__Vector_base<int,_std::allocator<int>_> +
                              (long)(pIVar7[-1].vect + 2));
          uVar9 = (uint)((uStack_490 & 0x200000000) == 0);
          uVar15 = (uint)((uStack_490 & 0x400000000) == 0);
          local_498[1] = (local_498[1] + uVar9) *
                         *(int *)((long)&(local_450->super_vector<int,_std::allocator<int>_>).
                                         super__Vector_base<int,_std::allocator<int>_> +
                                 (long)(pIVar7[-1].vect + 1)) - uVar9;
          local_498[0] = (local_498[0] + (~uStack_490._4_4_ & 1)) *
                         *(int *)((long)pIVar7[-1].vect +
                                 (long)&local_450->super_vector<int,_std::allocator<int>_>) -
                         (~uStack_490._4_4_ & 1);
          uStack_490 = CONCAT44(uStack_490._4_4_,
                                ((int)uStack_490 + uVar15) *
                                *(int *)((long)&(local_450->super_vector<int,_std::allocator<int>_>)
                                                .super__Vector_base<int,_std::allocator<int>_> +
                                        (long)(pIVar7[-1].vect + 2)) - uVar15);
        }
        for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
          if (*(int *)((long)((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_grid_size.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar18 * 4 + lVar12)
              < (local_498[lVar18] - (&ngrid)[lVar18]) + 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&bl);
            poVar13 = std::operator<<((ostream *)&bl,"Grid ");
            poVar13 = amrex::operator<<(poVar13,(Box *)&ngrid);
            poVar13 = std::operator<<(poVar13," too large");
            std::operator<<(poVar13,'\n');
            std::__cxx11::stringbuf::str();
            Error((string *)&in_finest);
            std::__cxx11::string::~string((string *)&in_finest);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bl);
          }
        }
        std::vector<amrex::Box,_std::allocator<amrex::Box>_>::push_back
                  ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&bl_1,(Box *)&ngrid);
      }
      BoxArray::define((BoxArray *)(regrid_ba + (long)local_458 * 0x68 + -0x68),&bl_1);
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&bl_1);
      lVar12 = lVar12 + 0xc;
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&log_file_name);
  }
LAB_00472c8e:
  this->loadbalance_with_workestimates = 0;
  ParmParse::queryAdd<int,_0>
            (&pp,"loadbalance_with_workestimates",&this->loadbalance_with_workestimates);
  this->loadbalance_level0_int = 2;
  ParmParse::queryAdd<int,_0>(&pp,"loadbalance_level0_int",&this->loadbalance_level0_int);
  this->loadbalance_max_fac = 1.5;
  ParmParse::queryAdd<double,_0>(&pp,"loadbalance_max_fac",&this->loadbalance_max_fac);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  return;
}

Assistant:

void
Amr::InitAmr ()
{
    BL_PROFILE("Amr::InitAmr()");

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(levelbld != nullptr, "ERROR: levelbld is nullptr");
    //
    // Global function that define state variables.
    //
    levelbld->variableSetUp();
    //
    // Set default values.
    //
    plot_int               = -1;
    small_plot_int         = -1;
    last_plotfile          = 0;
    last_smallplotfile     = -1;
    last_checkpoint        = 0;
    record_run_info        = false;
    record_grid_info       = false;
    file_name_digits       = 5;
    record_run_info_terse  = false;
    bUserStopRequest       = false;
    message_int            = 10;
#if defined(AMREX_USE_SENSEI_INSITU) && !defined(AMREX_NO_SENSEI_AMR_INST)
    insitu_bridge          = nullptr;
#endif

    for (int i = 0; i < AMREX_SPACEDIM; i++)
        isPeriodic[i] = false;

    ParmParse pp("amr");
    //
    // Check for command line flags.
    //
    pp.queryAdd("regrid_on_restart",regrid_on_restart);
    pp.queryAdd("use_efficient_regrid",use_efficient_regrid);
    pp.queryAdd("plotfile_on_restart",plotfile_on_restart);
    pp.queryAdd("insitu_on_restart",insitu_on_restart);
    pp.queryAdd("checkpoint_on_restart",checkpoint_on_restart);

    pp.queryAdd("compute_new_dt_on_regrid",compute_new_dt_on_regrid);

    pp.queryAdd("mffile_nstreams", mffile_nstreams);

#ifndef AMREX_NO_PROBINIT
    pp.queryAdd("probinit_natonce", probinit_natonce);
    probinit_natonce = std::max(1, std::min(ParallelDescriptor::NProcs(), probinit_natonce));
#endif

    pp.queryAdd("file_name_digits", file_name_digits);

    pp.queryAdd("initial_grid_file",initial_grids_file);
    pp.queryAdd("regrid_file"      , regrid_grids_file);

    pp.queryAdd("message_int", message_int);

    if (pp.contains("run_log"))
    {
        std::string log_file_name;
        pp.get("run_log",log_file_name);
        setRecordRunInfo(log_file_name);
    }
    if (pp.contains("run_log_terse"))
    {
        std::string log_file_name;
        pp.get("run_log_terse",log_file_name);
        setRecordRunInfoTerse(log_file_name);
    }
    if (pp.contains("grid_log"))
    {
        std::string grid_file_name;
        pp.get("grid_log",grid_file_name);
        setRecordGridInfo(grid_file_name);
    }

    if (pp.contains("data_log"))
    {
      int num_datalogs = pp.countval("data_log");
      datalog.resize(num_datalogs);
      datalogname.resize(num_datalogs);
      pp.queryarr("data_log",datalogname,0,num_datalogs);
      for (int i = 0; i < num_datalogs; i++)
        setRecordDataInfo(i,datalogname[i]);
    }

#ifndef AMREX_NO_PROBINIT
    probin_file = "probin";  // Make "probin" the default

    if (pp.contains("probin_file"))
    {
        pp.get("probin_file",probin_file);
    }
#endif
    //
    // If set, then restart from checkpoint file.
    //
    pp.queryAdd("restart", restart_chkfile);
    //
    // If set, then restart from plotfile.
    //
    pp.queryAdd("restart_from_plotfile", restart_pltfile);

    int nlev     = max_level+1;
    dt_level.resize(nlev);
    level_steps.resize(nlev);
    level_count.resize(nlev);
    n_cycle.resize(nlev);
    dt_min.resize(nlev);
    amr_level.resize(nlev);
    //
    // Set bogus values.
    //
    for (int i = 0; i < nlev; i++)
    {

        // Something nonzero so old & new will differ
#ifdef AMREX_USE_FLOAT
        dt_level[i]    = 1.e30f;
#else
        dt_level[i]    = 1.e200;
#endif
        level_steps[i] = 0;
        level_count[i] = 0;
        n_cycle[i]     = 0;
        dt_min[i]      = 0.0;
    }

    // Make the default regrid_int = 1 for all levels.
    if (max_level > 0)
    {
       regrid_int.resize(max_level);
       for (int i = 0; i < max_level; i++)
           regrid_int[i]  = 1;
    }

    //
    // Setup plot and checkpoint controls.
    //
    initPltAndChk();

    //
    // Setup insitu controls
    //
    initInSitu();

    //
    // Setup subcycling controls.
    //
    initSubcycle();

    //
    // Read in the regrid interval if max_level > 0.
    //
    if (max_level > 0)
    {
       int numvals = pp.countval("regrid_int");
       if (numvals == 1)
       {
           //
           // Set all values to the single available value.
           //
           int the_regrid_int = 0;
           pp.query("regrid_int",the_regrid_int);
           for (int i = 0; i < max_level; i++)
           {
               regrid_int[i] = the_regrid_int;
           }
       }
       else if (numvals == 0)
       {
           if (verbose) {
               amrex::Print(amrex::ErrorStream()) << "Using default regrid_int = 1 at all levels!\n";
           }
       }
       else if (numvals < max_level)
       {
           amrex::Error("You did not specify enough values of regrid_int");
       }
       else
       {
           //
           // Otherwise we expect a vector of max_level values
           //
           pp.queryarr("regrid_int",regrid_int,0,max_level);
       }
    }

    if (max_level > 0 && !initial_grids_file.empty())
    {
#define STRIP while( is.get() != '\n' ) {}
        std::ifstream is(initial_grids_file.c_str(),std::ios::in);

        if (!is.good())
            amrex::FileOpenFailed(initial_grids_file);

        int in_finest,ngrid;

        is >> in_finest;
        STRIP;
        initial_ba.resize(in_finest);

        use_fixed_upto_level = in_finest;
        if (in_finest > max_level)
           amrex::Error("You have fewer levels in your inputs file then in your grids file!");

        for (int lev = 1; lev <= in_finest; lev++)
        {
            BoxList bl;
            is >> ngrid;
            STRIP;
            for (int i = 0; i < ngrid; i++)
            {
                Box bx;
                is >> bx;
                STRIP;
                bx.refine(ref_ratio[lev-1]);
                bl.push_back(bx);
            }
            initial_ba[lev-1].define(bl);
        }
        is.close();
        if (verbose > 0) {
            amrex::Print() << "Read initial_ba. Size is " << initial_ba.size() << "\n";
        }

#undef STRIP
    }

    if (max_level > 0 && !regrid_grids_file.empty())
    {
#define STRIP while( is.get() != '\n' ) {}
        std::ifstream is(regrid_grids_file.c_str(),std::ios::in);

        if (!is.good())
            amrex::FileOpenFailed(regrid_grids_file);

        int in_finest,ngrid;

        is >> in_finest;
        STRIP;
        regrid_ba.resize(in_finest);
        for (int lev = 1; lev <= in_finest; lev++)
        {
            BoxList bl;
            is >> ngrid;
            STRIP;
            for (int i = 0; i < ngrid; i++)
            {
                Box bx;
                is >> bx;
                STRIP;
                 bx.refine(ref_ratio[lev-1]);
                 for (int idim = 0 ; idim < AMREX_SPACEDIM; ++idim)
                 {
                     if (bx.length(idim) > max_grid_size[lev][idim])
                     {
                         std::ostringstream ss;
                         ss << "Grid " << bx << " too large" << '\n';
                         amrex::Error(ss.str());
                     }
                 }
                 bl.push_back(bx);
            }
            regrid_ba[lev-1].define(bl);
        }
        is.close();
#undef STRIP
    }

    loadbalance_with_workestimates = 0;
    pp.queryAdd("loadbalance_with_workestimates", loadbalance_with_workestimates);

    loadbalance_level0_int = 2;
    pp.queryAdd("loadbalance_level0_int", loadbalance_level0_int);

    loadbalance_max_fac = 1.5;
    pp.queryAdd("loadbalance_max_fac", loadbalance_max_fac);
}